

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_test.cpp
# Opt level: O3

void model_test::copyTest(void)

{
  ModelImpl *this;
  SystemImpl *this_00;
  SystemImpl *this_01;
  FlowImpl *this_02;
  
  this = (ModelImpl *)operator_new(0x60);
  ModelImpl::ModelImpl(this);
  this_00 = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this_00);
  this_01 = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this_01);
  this_02 = (FlowImpl *)operator_new(0x38);
  FlowImpl::FlowImpl(this_02,(System *)this_00,(System *)this_01);
  *(undefined ***)this_02 = &PTR_execute_00106cb0;
  (**(code **)(*(long *)this + 8))(this,this_02);
  return;
}

Assistant:

void model_test::copyTest() {
    auto *m = new ModelImpl();
    auto *s1 = new SystemImpl();
    auto *s2 = new SystemImpl();
    auto *f = new FlowExp(s1, s2);
    m->add(f);
    auto m1 = m;
    assert(m1 == m);
}